

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_gen.c
# Opt level: O0

int retrieve_pk(uchar *pk_out,uchar *inv,gf *g,gf *L)

{
  long in_RDI;
  int i;
  int k;
  uchar col [768];
  int local_330;
  int local_32c;
  undefined1 local_328 [800];
  long local_8;
  
  local_8 = in_RDI;
  for (local_32c = 0x300; local_32c < 0xda0; local_32c = local_32c + 8) {
    pk_retrieve_8cols((uchar *)col._48_8_,col._44_4_,(uchar *)col._32_8_,(gf *)col._24_8_,
                      (gf *)col._16_8_);
    for (local_330 = 0; local_330 < 0x300; local_330 = local_330 + 1) {
      *(undefined1 *)(local_8 + (local_330 * 0x154 + (local_32c + -0x300) / 8)) =
           local_328[local_330];
    }
  }
  return 0;
}

Assistant:

int retrieve_pk(unsigned char *pk_out, unsigned char *inv, gf *g, gf *L)
{
  unsigned char col[SYS_T*GFBITS];

  // skip producing the identity matrix, i.e. the first SYS_T*GFBITS columns
  for(int k = SYS_T*GFBITS; k < SYS_N; k += 8)
  {
    pk_retrieve_8cols(col, k, inv, g, L);

    for(int i = 0; i < SYS_T*GFBITS; i++)
    {
      pk_out[i*PK_ROW_BYTES + (k - SYS_T*GFBITS)/8] = col[i];
    }
  }

  return 0;
}